

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt64x2Operation.cpp
# Opt level: O2

void Js::SIMDInt64x2Operation::OpReplaceLane(SIMDValue *dst,SIMDValue *src,int64 val,uint index)

{
  Type TVar1;
  Type TVar2;
  
  TVar1 = (src->field_0).i64[0];
  TVar2 = (src->field_0).i64[1];
  (dst->field_0).i32[0] = (Type)TVar1;
  (dst->field_0).i32[1] = (Type)((ulong)TVar1 >> 0x20);
  (dst->field_0).i32[2] = (Type)TVar2;
  (dst->field_0).i32[3] = (Type)((ulong)TVar2 >> 0x20);
  (dst->field_0).i64[index] = val;
  return;
}

Assistant:

void SIMDInt64x2Operation::OpReplaceLane(SIMDValue* dst, SIMDValue* src, int64 val, uint index)
    {
        dst->SetValue(*src);
        dst->i64[index] = val;
    }